

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O2

void clone_loadbang(t_clone *x,t_floatarg f)

{
  long lVar1;
  long lVar2;
  
  if ((f != 0.0) || (NAN(f))) {
    if ((f == 2.0) && (!NAN(f))) {
      lVar1 = 0;
      for (lVar2 = 0; lVar2 < x->x_n; lVar2 = lVar2 + 1) {
        canvas_closebang(*(_glist **)((long)&x->x_vec->c_gl + lVar1));
        lVar1 = lVar1 + 0x10;
      }
    }
  }
  else {
    lVar1 = 0;
    for (lVar2 = 0; lVar2 < x->x_n; lVar2 = lVar2 + 1) {
      canvas_loadbang(*(_glist **)((long)&x->x_vec->c_gl + lVar1));
      lVar1 = lVar1 + 0x10;
    }
  }
  return;
}

Assistant:

static void clone_loadbang(t_clone *x, t_floatarg f)
{
    int i;
    if (f == LB_LOAD)
        for (i = 0; i < x->x_n; i++)
            canvas_loadbang(x->x_vec[i].c_gl);
    else if (f == LB_CLOSE)
        for (i = 0; i < x->x_n; i++)
            canvas_closebang(x->x_vec[i].c_gl);
}